

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_DoIO(ym3438_t *chip)

{
  bool local_11;
  ym3438_t *chip_local;
  
  chip->write_a_en = (chip->write_a & 3) == 1;
  chip->write_d_en = (chip->write_d & 3) == 1;
  chip->write_a = chip->write_a << 1;
  chip->write_d = chip->write_d << 1;
  chip->busy = chip->write_busy;
  chip->write_busy_cnt = chip->write_busy_cnt + chip->write_busy;
  if ((chip->write_busy == '\0') || (local_11 = true, (int)(uint)chip->write_busy_cnt >> 5 != 0)) {
    local_11 = chip->write_d_en != '\0';
  }
  chip->write_busy = local_11;
  chip->write_busy_cnt = chip->write_busy_cnt & 0x1f;
  return;
}

Assistant:

void NOPN2_DoIO(ym3438_t *chip)
{
    /* Write signal check */
    chip->write_a_en = (chip->write_a & 0x03) == 0x01;
    chip->write_d_en = (chip->write_d & 0x03) == 0x01;
    chip->write_a <<= 1;
    chip->write_d <<= 1;
    /* Busy counter */
    chip->busy = chip->write_busy;
    chip->write_busy_cnt += chip->write_busy;
    chip->write_busy = (chip->write_busy && !(chip->write_busy_cnt >> 5)) || chip->write_d_en;
    chip->write_busy_cnt &= 0x1f;
}